

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void __thiscall TesterThread::UpdateObject(TesterThread *this)

{
  bool bVar1;
  int iVar2;
  size_type_conflict sVar3;
  reference pvVar4;
  int index;
  TesterThread *this_local;
  
  bVar1 = std::vector<TesterThread::Object,_std::allocator<TesterThread::Object>_>::empty
                    (&this->heap_);
  if (!bVar1) {
    sVar3 = std::vector<TesterThread::Object,_std::allocator<TesterThread::Object>_>::size
                      (&this->heap_);
    iVar2 = TestHarness::Uniform(&(this->rnd_).super_TestHarness,(int)sVar3);
    pvVar4 = std::vector<TesterThread::Object,_std::allocator<TesterThread::Object>_>::operator[]
                       (&this->heap_,(long)iVar2);
    CheckContents(this,pvVar4);
    pvVar4 = std::vector<TesterThread::Object,_std::allocator<TesterThread::Object>_>::operator[]
                       (&this->heap_,(long)iVar2);
    pvVar4->generation = pvVar4->generation + 1;
    pvVar4 = std::vector<TesterThread::Object,_std::allocator<TesterThread::Object>_>::operator[]
                       (&this->heap_,(long)iVar2);
    FillContents(this,pvVar4);
  }
  return;
}

Assistant:

void UpdateObject() {
    if (heap_.empty()) return;
    const int index = rnd_.Uniform(heap_.size());
    CheckContents(heap_[index]);
    heap_[index].generation++;
    FillContents(&heap_[index]);
  }